

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::add_dht_node(session_impl *this,endpoint *n)

{
  pointer pbVar1;
  undefined8 *puVar2;
  dht_tracker *this_00;
  pointer pbVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (dht_tracker *)0x0) {
    libtorrent::dht::dht_tracker::add_node(this_00,n);
    return;
  }
  uVar7 = ((long)(this->m_dht_nodes).
                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_dht_nodes).
                super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x1c;
  if (199 < uVar7) {
    uVar7 = random((aux *)(ulong)((int)uVar7 - 1));
    pbVar3 = (this->m_dht_nodes).
             super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = *(undefined8 *)((long)&(n->impl_).data_ + 8);
    uVar5 = *(undefined8 *)((long)&(n->impl_).data_ + 0xc);
    uVar6 = *(undefined8 *)((long)&(n->impl_).data_ + 0x14);
    pbVar1 = pbVar3 + (uVar7 & 0xffffffff);
    *(undefined8 *)&(pbVar1->impl_).data_ = *(undefined8 *)&(n->impl_).data_;
    *(undefined8 *)((long)&(pbVar1->impl_).data_ + 8) = uVar4;
    puVar2 = (undefined8 *)((long)&pbVar3[uVar7 & 0xffffffff].impl_.data_ + 0xc);
    *puVar2 = uVar5;
    puVar2[1] = uVar6;
    return;
  }
  ::std::
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ::push_back(&this->m_dht_nodes,n);
  return;
}

Assistant:

void session_impl::add_dht_node(udp::endpoint const& n)
	{
		TORRENT_ASSERT(is_single_thread());
		if (m_dht)
			m_dht->add_node(n);
		else if (m_dht_nodes.size() >= 200)
			m_dht_nodes[random(std::uint32_t(m_dht_nodes.size() - 1))] = n;
		else
			m_dht_nodes.push_back(n);
	}